

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_config.cc
# Opt level: O3

int ClientCertCallback(SSL *ssl,X509 **out_x509,EVP_PKEY **out_pkey)

{
  _Head_base<0UL,_evp_pkey_st_*,_false> _Var1;
  _Head_base<0UL,_x509_st_*,_false> _Var2;
  bool bVar3;
  int iVar4;
  pointer __p;
  void *pvVar5;
  TestState *pTVar6;
  UniquePtr<EVP_PKEY> pkey;
  UniquePtr<X509> x509;
  UniquePtr<struct_stack_st_X509> chain;
  _Head_base<0UL,_evp_pkey_st_*,_false> local_38;
  _Head_base<0UL,_x509_st_*,_false> local_30;
  __uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter> local_28;
  
  bVar3 = CheckCertificateRequest(ssl);
  iVar4 = -1;
  if (bVar3) {
    iVar4 = TestConfigExDataIndex();
    pvVar5 = SSL_get_ex_data((SSL *)ssl,iVar4);
    if ((*(char *)((long)pvVar5 + 0x269) == '\x01') &&
       (pTVar6 = GetTestState(ssl), pTVar6->cert_ready != true)) {
      return -1;
    }
    local_30._M_head_impl = (X509 *)0x0;
    local_28._M_t.super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl =
         (tuple<stack_st_X509_*,_bssl::internal::Deleter>)
         (_Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>)0x0;
    local_38._M_head_impl = (EVP_PKEY *)0x0;
    bVar3 = GetCertificate(ssl,(UniquePtr<X509> *)&local_30,
                           (UniquePtr<struct_stack_st_X509> *)&local_28,
                           (UniquePtr<EVP_PKEY> *)&local_38);
    _Var2._M_head_impl = local_30._M_head_impl;
    _Var1._M_head_impl = local_38._M_head_impl;
    iVar4 = -1;
    if (bVar3) {
      if (local_30._M_head_impl == (X509 *)0x0) {
        iVar4 = 0;
      }
      else {
        local_30._M_head_impl = (X509 *)0x0;
        *out_x509 = _Var2._M_head_impl;
        local_38._M_head_impl = (EVP_PKEY *)0x0;
        *out_pkey = _Var1._M_head_impl;
        iVar4 = 1;
      }
    }
    std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&local_38);
    std::unique_ptr<stack_st_X509,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<stack_st_X509,_bssl::internal::Deleter> *)&local_28);
    std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&local_30);
  }
  return iVar4;
}

Assistant:

static int ClientCertCallback(SSL *ssl, X509 **out_x509, EVP_PKEY **out_pkey) {
  if (!CheckCertificateRequest(ssl)) {
    return -1;
  }

  if (GetTestConfig(ssl)->async && !GetTestState(ssl)->cert_ready) {
    return -1;
  }

  bssl::UniquePtr<X509> x509;
  bssl::UniquePtr<STACK_OF(X509)> chain;
  bssl::UniquePtr<EVP_PKEY> pkey;
  if (!GetCertificate(ssl, &x509, &chain, &pkey)) {
    return -1;
  }

  // Return zero for no certificate.
  if (!x509) {
    return 0;
  }

  // Chains and asynchronous private keys are not supported with client_cert_cb.
  *out_x509 = x509.release();
  *out_pkey = pkey.release();
  return 1;
}